

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

errc psql::deserialize_struct<0ul,psql::authentication_request>
               (authentication_request *output,deserialization_context *ctx)

{
  errc err;
  __tuple_element_t<0UL,_tuple<int_authentication_request::*,_string_eof_authentication_request::*>_>
  pmem;
  tuple<int_psql::authentication_request::*,_psql::string_eof_psql::authentication_request::*>
  fields;
  deserialization_context *ctx_local;
  authentication_request *output_local;
  
  output_local._4_4_ = deserialize<int>(&output->auth_type,ctx);
  if (output_local._4_4_ == ok) {
    output_local._4_4_ = deserialize_struct<1ul,psql::authentication_request>(output,ctx);
  }
  return output_local._4_4_;
}

Assistant:

errc deserialize_struct(
	[[maybe_unused]] T& output,
	[[maybe_unused]] deserialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return errc::ok;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		errc err = deserialize(output.*pmem, ctx);
		if (err != errc::ok)
		{
			return err;
		}
		else
		{
			return deserialize_struct<index+1>(output, ctx);
		}
	}
}